

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

ScriptContext * Js::ScriptContext::New(ThreadContext *threadContext)

{
  undefined8 uVar1;
  HeapAllocator *alloc;
  ScriptContext *pSVar2;
  undefined1 local_50 [8];
  TrackAllocData data;
  AutoPtr<Js::ScriptContext,_Memory::HeapAllocator> scriptContext;
  
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2d86450;
  data.filename._0_4_ = 0x37;
  alloc = Memory::HeapAllocator::TrackAllocInfo
                    (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
  pSVar2 = (ScriptContext *)new<Memory::HeapAllocator>(0x1470,alloc,0x300d4a);
  ScriptContext(pSVar2,threadContext);
  data._32_8_ = pSVar2;
  pSVar2 = BasePtr<Js::ScriptContext>::operator->((BasePtr<Js::ScriptContext> *)&data.line);
  InitializeAllocations(pSVar2);
  uVar1 = data._32_8_;
  data.line = 0;
  data._36_4_ = 0;
  AutoPtr<Js::ScriptContext,_Memory::HeapAllocator>::~AutoPtr
            ((AutoPtr<Js::ScriptContext,_Memory::HeapAllocator> *)&data.line);
  return (ScriptContext *)uVar1;
}

Assistant:

ScriptContext * ScriptContext::New(ThreadContext * threadContext)
    {
        AutoPtr<ScriptContext> scriptContext(HeapNew(ScriptContext, threadContext));
        scriptContext->InitializeAllocations();
        return scriptContext.Detach();
    }